

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O0

void __thiscall Application::create_window(Application *this)

{
  GLFWwindow *pGVar1;
  GLFWwindow *in_RDI;
  uint32_t in_stack_ffffffffffffffe8;
  uint32_t in_stack_ffffffffffffffec;
  GLFWwindow *handle;
  
  handle = in_RDI;
  pGVar1 = myvk::GLFWCreateWindow
                     ((char *)in_RDI,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8,false);
  *(GLFWwindow **)in_RDI = pGVar1;
  glfwSetWindowUserPointer
            (in_RDI,(void *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  glfwSetKeyCallback(handle,(GLFWkeyfun)in_RDI);
  glfwSetFramebufferSizeCallback(handle,(GLFWframebuffersizefun)in_RDI);
  return;
}

Assistant:

void Application::create_window() {
	m_window = myvk::GLFWCreateWindow(kAppName, kDefaultWidth, kDefaultHeight, true);
	glfwSetWindowUserPointer(m_window, this);
	glfwSetKeyCallback(m_window, glfw_key_callback);
	glfwSetFramebufferSizeCallback(m_window, glfw_framebuffer_resize_callback);
}